

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.h
# Opt level: O3

string * __thiscall cmExtraCodeBlocksGenerator::GetName_abi_cxx11_(cmExtraCodeBlocksGenerator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x636f6c4265646f43;
  *(undefined2 *)((long)&in_RDI->field_2 + 8) = 0x736b;
  in_RDI->_M_string_length = 10;
  (in_RDI->field_2)._M_local_buf[10] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string GetName() const
                         { return cmExtraCodeBlocksGenerator::GetActualName();}